

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O0

int parseError(char *msg)

{
  int local_14;
  int i;
  char *msg_local;
  
  info_impl("parseError",0x1ad,"Parse Error: at line %d, position %d, %s",(ulong)(uint)inputLine,
            (ulong)(uint)inputPosition,msg);
  info_impl("parseError",0x1ae,"\"%s\"",inputBuffer);
  for (local_14 = 0; local_14 < inputPosition + -1; local_14 = local_14 + 1) {
    fprintf(_stderr,"-");
  }
  fprintf(_stderr,"^\n");
  fflush(_stderr);
  exit(1);
}

Assistant:

int parseError(char *msg)
{
    info("Parse Error: at line %d, position %d, %s", inputLine, inputPosition, msg);
    info("\"%s\"", inputBuffer);

    /* print a pointer to the location that we found something wrong. */
    for(int i=0; i < (inputPosition-1); i++) {
        fprintf(stderr, "-");
    }

    fprintf(stderr, "^\n");

    fflush(stderr);

    exit(1);
    return 0;
}